

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void windowAggStep(WindowCodeArg *p,Window *pMWin,int csr,int bInverse,int reg)

{
  byte bVar1;
  Parse *pParse;
  ExprList *pEVar2;
  FuncDef *pP4;
  int p3;
  Vdbe *p_00;
  CollSeq *zP4;
  int p2;
  long lVar3;
  int p1;
  u8 *puVar4;
  int iVar5;
  Window *pWVar6;
  int iVar7;
  long lVar8;
  int local_64;
  int local_58;
  int local_54;
  
  pParse = p->pParse;
  p_00 = sqlite3GetVdbe(pParse);
  for (pWVar6 = pMWin; pWVar6 != (Window *)0x0; pWVar6 = pWVar6->pNextWin) {
    local_64 = 0;
    if ((pWVar6->bExprArgs == '\0') &&
       (pEVar2 = (pWVar6->pOwner->x).pList, pEVar2 != (ExprList *)0x0)) {
      local_64 = pEVar2->nExpr;
    }
    pP4 = pWVar6->pWFunc;
    iVar7 = 0;
    iVar5 = 0;
    if (0 < local_64) {
      iVar7 = 0;
      iVar5 = local_64;
    }
    for (; iVar5 != iVar7; iVar7 = iVar7 + 1) {
      if ((iVar7 == 1) && (pP4->zName == "nth_value")) {
        p1 = pMWin->iEphCsr;
        p2 = pWVar6->iArgCol + 1;
        p3 = reg + 1;
      }
      else {
        p2 = pWVar6->iArgCol + iVar7;
        p1 = csr;
        p3 = reg + iVar7;
      }
      sqlite3VdbeAddOp3(p_00,0x5e,p1,p2,p3);
    }
    if (pWVar6->pFilter == (Expr *)0x0) {
      local_54 = 0;
    }
    else {
      iVar7 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(p_00,0x5e,csr,pWVar6->iArgCol + local_64,iVar7);
      local_54 = sqlite3VdbeAddOp3(p_00,0x11,iVar7,0,1);
      if (iVar7 != 0) {
        bVar1 = pParse->nTempReg;
        if ((ulong)bVar1 < 8) {
          pParse->nTempReg = bVar1 + 1;
          pParse->aTempReg[bVar1] = iVar7;
        }
      }
    }
    if (((pMWin->regStartRowid == 0) && ((pP4->funcFlags & 0x1000) != 0)) && (pWVar6->eStart != '[')
       ) {
      iVar7 = sqlite3VdbeAddOp1(p_00,0x33,reg);
      if (bInverse == 0) {
        sqlite3VdbeAddOp2(p_00,0x56,pWVar6->regApp + 1,1);
        sqlite3VdbeAddOp2(p_00,0x51,reg,pWVar6->regApp);
        sqlite3VdbeAddOp3(p_00,0x61,pWVar6->regApp,2,pWVar6->regApp + 2);
        sqlite3VdbeAddOp2(p_00,0x8a,pWVar6->csrApp,pWVar6->regApp + 2);
      }
      else {
        sqlite3VdbeAddOp4Int(p_00,0x17,pWVar6->csrApp,0,reg,1);
        sqlite3VdbeAddOp1(p_00,0x82,pWVar6->csrApp);
        sqlite3VdbeJumpHere(p_00,p_00->nOp + -2);
      }
      sqlite3VdbeJumpHere(p_00,iVar7);
    }
    else if (pWVar6->regApp == 0) {
      if (pP4->xSFunc != noopStepFunc) {
        local_58 = reg;
        if (pWVar6->bExprArgs != '\0') {
          lVar8 = (long)p_00->nOp;
          local_64 = ((pWVar6->pOwner->x).pList)->nExpr;
          local_58 = sqlite3GetTempRange(pParse,local_64);
          sqlite3ExprCodeExprList(pParse,(pWVar6->pOwner->x).pList,local_58,0,'\0');
          iVar7 = p_00->nOp;
          lVar3 = lVar8 * 0x18;
          for (; lVar8 < iVar7; lVar8 = lVar8 + 1) {
            puVar4 = &sqlite3VdbeGetOp_dummy;
            if (p_00->db->mallocFailed == '\0') {
              puVar4 = &p_00->aOp->opcode + lVar3;
            }
            if ((*puVar4 == '^') && (*(int *)(puVar4 + 4) == pMWin->iEphCsr)) {
              *(int *)(puVar4 + 4) = csr;
            }
            lVar3 = lVar3 + 0x18;
          }
        }
        if ((pP4->funcFlags & 0x20) != 0) {
          zP4 = sqlite3ExprNNCollSeq(pParse,((pWVar6->pOwner->x).pList)->a[0].pExpr);
          sqlite3VdbeAddOp4(p_00,0x55,0,0,0,(char *)zP4,-2);
        }
        sqlite3VdbeAddOp3(p_00,(bInverse == 0) + 0xa1,bInverse,local_58,pWVar6->regAccum);
        sqlite3VdbeAppendP4(p_00,pP4,-7);
        if (0 < (long)p_00->nOp) {
          p_00->aOp[(long)p_00->nOp + -1].p5 = (u16)local_64;
        }
        if (pWVar6->bExprArgs != '\0') {
          sqlite3ReleaseTempRange(pParse,local_58,local_64);
        }
      }
    }
    else {
      sqlite3VdbeAddOp2(p_00,0x56,(pWVar6->regApp - bInverse) + 1,1);
    }
    if (local_54 != 0) {
      sqlite3VdbeJumpHere(p_00,local_54);
    }
  }
  return;
}

Assistant:

static void windowAggStep(
  WindowCodeArg *p,
  Window *pMWin,                  /* Linked list of window functions */
  int csr,                        /* Read arguments from this cursor */
  int bInverse,                   /* True to invoke xInverse instead of xStep */
  int reg                         /* Array of registers */
){
  Parse *pParse = p->pParse;
  Vdbe *v = sqlite3GetVdbe(pParse);
  Window *pWin;
  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    FuncDef *pFunc = pWin->pWFunc;
    int regArg;
    int nArg = pWin->bExprArgs ? 0 : windowArgCount(pWin);
    int i;
    int addrIf = 0;

    assert( bInverse==0 || pWin->eStart!=TK_UNBOUNDED );

    /* All OVER clauses in the same window function aggregate step must
    ** be the same. */
    assert( pWin==pMWin || sqlite3WindowCompare(pParse,pWin,pMWin,0)!=1 );

    for(i=0; i<nArg; i++){
      if( i!=1 || pFunc->zName!=nth_valueName ){
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol+i, reg+i);
      }else{
        sqlite3VdbeAddOp3(v, OP_Column, pMWin->iEphCsr, pWin->iArgCol+i, reg+i);
      }
    }
    regArg = reg;

    if( pWin->pFilter ){
      int regTmp;
      assert( ExprUseXList(pWin->pOwner) );
      assert( pWin->bExprArgs || !nArg ||nArg==pWin->pOwner->x.pList->nExpr );
      assert( pWin->bExprArgs || nArg  ||pWin->pOwner->x.pList==0 );
      regTmp = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol+nArg,regTmp);
      addrIf = sqlite3VdbeAddOp3(v, OP_IfNot, regTmp, 0, 1);
      VdbeCoverage(v);
      sqlite3ReleaseTempReg(pParse, regTmp);
    }

    if( pMWin->regStartRowid==0
     && (pFunc->funcFlags & SQLITE_FUNC_MINMAX)
     && (pWin->eStart!=TK_UNBOUNDED)
    ){
      int addrIsNull = sqlite3VdbeAddOp1(v, OP_IsNull, regArg);
      VdbeCoverage(v);
      if( bInverse==0 ){
        sqlite3VdbeAddOp2(v, OP_AddImm, pWin->regApp+1, 1);
        sqlite3VdbeAddOp2(v, OP_SCopy, regArg, pWin->regApp);
        sqlite3VdbeAddOp3(v, OP_MakeRecord, pWin->regApp, 2, pWin->regApp+2);
        sqlite3VdbeAddOp2(v, OP_IdxInsert, pWin->csrApp, pWin->regApp+2);
      }else{
        sqlite3VdbeAddOp4Int(v, OP_SeekGE, pWin->csrApp, 0, regArg, 1);
        VdbeCoverageNeverTaken(v);
        sqlite3VdbeAddOp1(v, OP_Delete, pWin->csrApp);
        sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
      }
      sqlite3VdbeJumpHere(v, addrIsNull);
    }else if( pWin->regApp ){
      assert( pWin->pFilter==0 );
      assert( pFunc->zName==nth_valueName
           || pFunc->zName==first_valueName
      );
      assert( bInverse==0 || bInverse==1 );
      sqlite3VdbeAddOp2(v, OP_AddImm, pWin->regApp+1-bInverse, 1);
    }else if( pFunc->xSFunc!=noopStepFunc ){
      if( pWin->bExprArgs ){
        int iOp = sqlite3VdbeCurrentAddr(v);
        int iEnd;

        assert( ExprUseXList(pWin->pOwner) );
        nArg = pWin->pOwner->x.pList->nExpr;
        regArg = sqlite3GetTempRange(pParse, nArg);
        sqlite3ExprCodeExprList(pParse, pWin->pOwner->x.pList, regArg, 0, 0);

        for(iEnd=sqlite3VdbeCurrentAddr(v); iOp<iEnd; iOp++){
          VdbeOp *pOp = sqlite3VdbeGetOp(v, iOp);
          if( pOp->opcode==OP_Column && pOp->p1==pMWin->iEphCsr ){
            pOp->p1 = csr;
          }
        }
      }
      if( pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL ){
        CollSeq *pColl;
        assert( nArg>0 );
        assert( ExprUseXList(pWin->pOwner) );
        pColl = sqlite3ExprNNCollSeq(pParse, pWin->pOwner->x.pList->a[0].pExpr);
        sqlite3VdbeAddOp4(v, OP_CollSeq, 0,0,0, (const char*)pColl, P4_COLLSEQ);
      }
      sqlite3VdbeAddOp3(v, bInverse? OP_AggInverse : OP_AggStep,
                        bInverse, regArg, pWin->regAccum);
      sqlite3VdbeAppendP4(v, pFunc, P4_FUNCDEF);
      sqlite3VdbeChangeP5(v, (u16)nArg);
      if( pWin->bExprArgs ){
        sqlite3ReleaseTempRange(pParse, regArg, nArg);
      }
    }

    if( addrIf ) sqlite3VdbeJumpHere(v, addrIf);
  }
}